

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void basic_suite::test_true_white(void)

{
  char input [9];
  decoder_type decoder;
  value local_178 [2];
  value_type local_170 [16];
  basic_decoder<char> local_160;
  
  builtin_memcpy(local_170,"  true  ",9);
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<9ul>
            (&local_160,(value_type (*) [9])local_170);
  local_178[0] = local_160.current.code;
  local_178[1] = 6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::true_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x140,"void basic_suite::test_true_white()",local_178,local_178 + 1);
  trial::protocol::json::detail::basic_decoder<char>::next(&local_160);
  local_178[0] = local_160.current.code;
  local_178[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x142,"void basic_suite::test_true_white()",local_178,local_178 + 1);
  return;
}

Assistant:

void test_true_white()
{
    const char input[] = "  true  ";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::true_value);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}